

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool collectComments;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Value *pVVar9;
  OurCharReader *this_00;
  Value *this_01;
  OurFeatures local_40;
  
  this_01 = &this->settings_;
  pVVar9 = Value::operator[](this_01,"collectComments");
  collectComments = Value::asBool(pVVar9);
  pVVar9 = Value::operator[](this_01,"allowComments");
  bVar1 = Value::asBool(pVVar9);
  pVVar9 = Value::operator[](this_01,"strictRoot");
  bVar2 = Value::asBool(pVVar9);
  pVVar9 = Value::operator[](this_01,"allowDroppedNullPlaceholders");
  bVar3 = Value::asBool(pVVar9);
  pVVar9 = Value::operator[](this_01,"allowNumericKeys");
  bVar4 = Value::asBool(pVVar9);
  pVVar9 = Value::operator[](this_01,"allowSingleQuotes");
  bVar5 = Value::asBool(pVVar9);
  pVVar9 = Value::operator[](this_01,"stackLimit");
  local_40.stackLimit_ = Value::asInt(pVVar9);
  pVVar9 = Value::operator[](this_01,"failIfExtra");
  bVar6 = Value::asBool(pVVar9);
  pVVar9 = Value::operator[](this_01,"rejectDupKeys");
  bVar7 = Value::asBool(pVVar9);
  pVVar9 = Value::operator[](this_01,"allowSpecialFloats");
  bVar8 = Value::asBool(pVVar9);
  local_40.failIfExtra_ = bVar6;
  local_40.allowSingleQuotes_ = bVar5;
  local_40.strictRoot_ = bVar2;
  local_40.allowComments_ = bVar1;
  local_40.allowDroppedNullPlaceholders_ = bVar3;
  local_40.allowNumericKeys_ = bVar4;
  local_40.allowSpecialFloats_ = bVar8;
  local_40.rejectDupKeys_ = bVar7;
  this_00 = (OurCharReader *)operator_new(0x128);
  OurCharReader::OurCharReader(this_00,collectComments,&local_40);
  return &this_00->super_CharReader;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const
{
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ = settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();
  features.stackLimit_ = settings_["stackLimit"].asInt();
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  return new OurCharReader(collectComments, features);
}